

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O0

void __thiscall kj::TimerImpl::TimerImpl(TimerImpl *this,TimePoint startTime)

{
  TimerImpl *this_local;
  TimePoint startTime_local;
  
  Timer::Timer(&this->super_Timer);
  (this->super_Timer).super_MonotonicClock._vptr_MonotonicClock = (_func_int **)&PTR_now_00da0968;
  (this->time).value.value = (long)startTime.value.value;
  heap<kj::TimerImpl::Impl>();
  Maybe<kj::TimerImpl::SleepHooks_&>::Maybe(&this->sleepHooks);
  return;
}

Assistant:

TimerImpl::TimerImpl(TimePoint startTime)
    : time(startTime), impl(heap<Impl>()) {}